

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

void __thiscall
icu_63::CollationLoader::CollationLoader
          (CollationLoader *this,CollationCacheEntry *re,Locale *requested,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  UnifiedCache *pUVar4;
  char *__s1;
  undefined1 local_120 [4];
  int32_t typeLength;
  char *local_40;
  char *baseName;
  UErrorCode *local_28;
  UErrorCode *errorCode_local;
  Locale *requested_local;
  CollationCacheEntry *re_local;
  CollationLoader *this_local;
  
  local_28 = errorCode;
  errorCode_local = (UErrorCode *)requested;
  requested_local = (Locale *)re;
  re_local = (CollationCacheEntry *)this;
  pUVar4 = UnifiedCache::getInstance(errorCode);
  this->cache = pUVar4;
  this->rootEntry = (CollationCacheEntry *)requested_local;
  Locale::Locale(&this->validLocale,(Locale *)(requested_local->script + 4));
  Locale::Locale(&this->locale,(Locale *)errorCode_local);
  this->typesTried = 0;
  this->typeFallback = '\0';
  this->bundle = (UResourceBundle *)0x0;
  this->collations = (UResourceBundle *)0x0;
  this->data = (UResourceBundle *)0x0;
  this->type[0] = '\0';
  this->defaultType[0] = '\0';
  UVar1 = ::U_FAILURE(*local_28);
  if (UVar1 == '\0') {
    local_40 = Locale::getBaseName(&this->locale);
    __s1 = Locale::getName(&this->locale);
    iVar2 = strcmp(__s1,local_40);
    if (iVar2 != 0) {
      Locale::Locale((Locale *)local_120,local_40,(char *)0x0,(char *)0x0,(char *)0x0);
      Locale::operator=(&this->locale,(Locale *)local_120);
      Locale::~Locale((Locale *)local_120);
      iVar3 = Locale::getKeywordValue((Locale *)errorCode_local,"collation",this->type,0xf,local_28)
      ;
      UVar1 = ::U_FAILURE(*local_28);
      if (UVar1 == '\0') {
        this->type[iVar3] = '\0';
        if (iVar3 != 0) {
          iVar2 = uprv_stricmp_63(this->type,"default");
          if (iVar2 == 0) {
            this->type[0] = '\0';
          }
          else {
            T_CString_toLowerCase_63(this->type);
            Locale::setKeywordValue(&this->locale,"collation",this->type,local_28);
          }
        }
      }
      else {
        *local_28 = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
  }
  return;
}

Assistant:

CollationLoader::CollationLoader(const CollationCacheEntry *re, const Locale &requested,
                                 UErrorCode &errorCode)
        : cache(UnifiedCache::getInstance(errorCode)), rootEntry(re),
          validLocale(re->validLocale), locale(requested),
          typesTried(0), typeFallback(FALSE),
          bundle(NULL), collations(NULL), data(NULL) {
    type[0] = 0;
    defaultType[0] = 0;
    if(U_FAILURE(errorCode)) { return; }

    // Canonicalize the locale ID: Ignore all irrelevant keywords.
    const char *baseName = locale.getBaseName();
    if(uprv_strcmp(locale.getName(), baseName) != 0) {
        locale = Locale(baseName);

        // Fetch the collation type from the locale ID.
        int32_t typeLength = requested.getKeywordValue("collation",
                type, UPRV_LENGTHOF(type) - 1, errorCode);
        if(U_FAILURE(errorCode)) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        type[typeLength] = 0;  // in case of U_NOT_TERMINATED_WARNING
        if(typeLength == 0) {
            // No collation type.
        } else if(uprv_stricmp(type, "default") == 0) {
            // Ignore "default" (case-insensitive).
            type[0] = 0;
        } else {
            // Copy the collation type.
            T_CString_toLowerCase(type);
            locale.setKeywordValue("collation", type, errorCode);
        }
    }
}